

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_init_memory_write__internal
                    (ma_dr_wav *pWav,void **ppData,size_t *pDataSize,ma_dr_wav_data_format *pFormat,
                    ma_uint64 totalSampleCount,ma_bool32 isSequential,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_wav_seek_proc in_RCX;
  ma_dr_wav_write_proc in_RDX;
  undefined8 *in_RSI;
  ma_dr_wav_data_format *in_RDI;
  void *in_R8;
  ma_dr_wav_data_format *unaff_retaddr;
  ma_dr_wav *in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_bool32 mVar1;
  
  if ((in_RSI == (undefined8 *)0x0) || (in_RDX == (ma_dr_wav_write_proc)0x0)) {
    mVar1 = 0;
  }
  else {
    *in_RSI = 0;
    *(undefined8 *)in_RDX = 0;
    mVar1 = ma_dr_wav_preinit_write
                      ((ma_dr_wav *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(ma_bool32)((ulong)in_RSI >> 0x20),in_RDX,in_RCX,in_R8,
                       (ma_allocation_callbacks *)CONCAT44(isSequential,in_stack_00000010));
    if (mVar1 == 0) {
      mVar1 = 0;
    }
    else {
      *(undefined8 **)&in_RDI[10].bitsPerSample = in_RSI;
      *(ma_dr_wav_write_proc *)&in_RDI[0xb].format = in_RDX;
      in_RDI[0xb].sampleRate = 0;
      in_RDI[0xb].bitsPerSample = 0;
      in_RDI[0xc].container = ma_dr_wav_container_riff;
      in_RDI[0xc].format = 0;
      in_RDI[0xc].channels = 0;
      in_RDI[0xc].sampleRate = 0;
      mVar1 = ma_dr_wav_init_write__internal
                        (in_stack_00000008,unaff_retaddr,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  return mVar1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_memory_write__internal(ma_dr_wav* pWav, void** ppData, size_t* pDataSize, const ma_dr_wav_data_format* pFormat, ma_uint64 totalSampleCount, ma_bool32 isSequential, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (ppData == NULL || pDataSize == NULL) {
        return MA_FALSE;
    }
    *ppData = NULL;
    *pDataSize = 0;
    if (!ma_dr_wav_preinit_write(pWav, pFormat, isSequential, ma_dr_wav__on_write_memory, ma_dr_wav__on_seek_memory_write, pWav, pAllocationCallbacks)) {
        return MA_FALSE;
    }
    pWav->memoryStreamWrite.ppData = ppData;
    pWav->memoryStreamWrite.pDataSize = pDataSize;
    pWav->memoryStreamWrite.dataSize = 0;
    pWav->memoryStreamWrite.dataCapacity = 0;
    pWav->memoryStreamWrite.currentWritePos = 0;
    return ma_dr_wav_init_write__internal(pWav, pFormat, totalSampleCount);
}